

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::Data
          (Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *this,
          Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *other,size_t reserved)

{
  Data *pDVar1;
  bool bVar2;
  size_t sVar3;
  QByteArray *pQVar4;
  MultiNode<QByteArray,_QByteArray> *in_RSI;
  Span<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar5;
  size_t otherNSpans;
  MultiNode<QByteArray,_QByteArray> *newNode;
  MultiNode<QByteArray,_QByteArray> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *this_00;
  QByteArray *key;
  MultiNode<QByteArray,_QByteArray> *this_01;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  QByteArray *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  *(char **)(in_RDI->offsets + 8) = (in_RSI->key).d.ptr;
  in_RDI->offsets[0x10] = '\0';
  in_RDI->offsets[0x11] = '\0';
  in_RDI->offsets[0x12] = '\0';
  in_RDI->offsets[0x13] = '\0';
  in_RDI->offsets[0x14] = '\0';
  in_RDI->offsets[0x15] = '\0';
  in_RDI->offsets[0x16] = '\0';
  in_RDI->offsets[0x17] = '\0';
  *(Chain **)(in_RDI->offsets + 0x18) = in_RSI->value;
  in_RDI->offsets[0x20] = '\0';
  in_RDI->offsets[0x21] = '\0';
  in_RDI->offsets[0x22] = '\0';
  in_RDI->offsets[0x23] = '\0';
  in_RDI->offsets[0x24] = '\0';
  in_RDI->offsets[0x25] = '\0';
  in_RDI->offsets[0x26] = '\0';
  in_RDI->offsets[0x27] = '\0';
  qMax<unsigned_long>((unsigned_long *)(in_RDI->offsets + 8),&local_20);
  sVar3 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  *(size_t *)(in_RDI->offsets + 0x10) = sVar3;
  RVar5 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)(in_RDI->offsets + 0x20) = RVar5.spans;
  pQVar4 = (QByteArray *)((ulong)(in_RSI->key).d.size >> 7);
  this_00 = in_RDI;
  key = pQVar4;
  this_01 = in_RSI;
  for (local_40 = (QByteArray *)0x0; local_40 < pQVar4;
      local_40 = (QByteArray *)((long)&(local_40->d).d + 1)) {
    pDVar1 = in_RSI[1].key.d.d;
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::hasNode
                        ((Span<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)
                         (pDVar1 + (long)local_40 * 9),i);
      if (bVar2) {
        Span<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::at(this_00,(size_t)in_RDI);
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = findBucket<QByteArray>
                             ((Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)RVar5.spans,
                              key);
        Bucket::insert((Bucket *)0x124e37);
        MultiNode<QByteArray,_QByteArray>::MultiNode
                  (this_01,(MultiNode<QByteArray,_QByteArray> *)RVar5.nSpans);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }